

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O2

fdb_status wal_snapshot_close(snap_handle *shandle,filemgr *file)

{
  list_elem *plVar1;
  uint16_t uVar2;
  avl_node *node;
  avl_node *paVar3;
  list_elem *__ptr;
  
  uVar2 = atomic_decr_uint16_t(&shandle->ref_cnt_kvs,memory_order_seq_cst);
  if ((uVar2 == 0) && ((shandle->is_persisted_snapshot != false || (shandle->snap_tag_idx == 0)))) {
    node = avl_first(&shandle->key_tree);
    while (node != (avl_node *)0x0) {
      paVar3 = avl_next(node);
      avl_remove(&shandle->key_tree,node);
      free(node[-3].left[1].parent);
      free(node[-3].left);
      free(&node[-5].right);
      node = paVar3;
    }
    __ptr = (shandle->active_txn_list).head;
    while (__ptr != (list_elem *)0x0) {
      plVar1 = __ptr->next;
      free(__ptr);
      __ptr = plVar1;
    }
    free(shandle);
  }
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status wal_snapshot_close(struct snap_handle *shandle,
                              struct filemgr *file)
{
    if (!atomic_decr_uint16_t(&shandle->ref_cnt_kvs)) {
        struct avl_node *a, *nexta;
        if (!shandle->is_persisted_snapshot &&
            shandle->snap_tag_idx) { // the KVS did have items in WAL..
            return FDB_RESULT_SUCCESS;
        }
        for (a = avl_first(&shandle->key_tree);
             a; a = nexta) {
            struct wal_item *item = _get_entry(a, struct wal_item, avl_keysnap);
            nexta = avl_next(a);
            avl_remove(&shandle->key_tree, &item->avl_keysnap);
            free(item->header->key);
            free(item->header);
            free(item);
        }
        for (struct list_elem *e = list_begin(&shandle->active_txn_list); e;) {
            struct list_elem *e_next = list_next(e);
            struct wal_txn_wrapper *active_txn = _get_entry(e,
                                                   struct wal_txn_wrapper, le);
            free(active_txn);
            e = e_next;
        }
        free(shandle);
    }
    return FDB_RESULT_SUCCESS;
}